

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtconcurrentthreadengine.cpp
# Opt level: O0

void __thiscall
QtConcurrent::ThreadEngineBase::handleException(ThreadEngineBase *this,QException *exception)

{
  long lVar1;
  byte bVar2;
  long in_RDI;
  long in_FS_OFFSET;
  QMutexLocker<QBasicMutex> lock;
  QBasicMutex *in_stack_ffffffffffffffa8;
  QMutexLocker<QBasicMutex> *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RDI + 0x10) == 0) {
    QMutexLocker<QBasicMutex>::QMutexLocker(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    bVar2 = QtPrivate::ExceptionStore::hasException();
    if ((bVar2 & 1) == 0) {
      QtPrivate::ExceptionStore::setException((QException *)(in_RDI + 0x30));
    }
    QMutexLocker<QBasicMutex>::~QMutexLocker(in_stack_ffffffffffffffb0);
  }
  else {
    QFutureInterfaceBase::reportException(*(QException **)(in_RDI + 0x10));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ThreadEngineBase::handleException(const QException &exception)
{
    if (futureInterface) {
        futureInterface->reportException(exception);
    } else {
        QMutexLocker lock(&mutex);
        if (!exceptionStore.hasException())
            exceptionStore.setException(exception);
    }
}